

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O1

void __thiscall
BMRS_XZ<RemSP>::FindRuns
          (BMRS_XZ<RemSP> *this,uint64_t *bits_start,uint64_t *bits_flag,int height,int data_width,
          Run *runs)

{
  ulong *puVar1;
  ushort uVar2;
  uint uVar3;
  uint *puVar4;
  unsigned_short uVar5;
  uint uVar6;
  ulong *puVar7;
  long lVar8;
  short sVar9;
  ushort uVar10;
  Run *pRVar11;
  ulong uVar12;
  ushort uVar13;
  long lVar14;
  short sVar15;
  uint uVar16;
  uint64_t *puVar17;
  ulong uVar18;
  uint64_t uVar19;
  long lVar20;
  long lVar21;
  ulong *puVar22;
  long lVar23;
  Run *pRVar24;
  uint local_98;
  Run *local_90;
  
  puVar4 = RemSP::P_;
  lVar8 = (long)data_width;
  uVar19 = *bits_start;
  sVar15 = 0;
  puVar17 = bits_start;
  local_90 = runs;
  do {
    lVar21 = 0;
    if (uVar19 != 0) {
      for (; (uVar19 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
      }
    }
    sVar9 = (short)lVar21;
    if (uVar19 == 0) {
      do {
        puVar17 = puVar17 + 1;
        if (puVar17 == bits_start + lVar8) {
          local_90->start_pos = 0xffff;
          local_90->end_pos = 0xffff;
          if (height < 2) {
LAB_0023fe8d:
            puVar4 = RemSP::P_;
            uVar6 = 1;
            if (1 < RemSP::length_) {
              uVar6 = 1;
              uVar18 = 1;
              do {
                if (puVar4[uVar18] < uVar18) {
                  puVar4[uVar18] = puVar4[puVar4[uVar18]];
                }
                else {
                  puVar4[uVar18] = uVar6;
                  uVar6 = uVar6 + 1;
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 < RemSP::length_);
            }
            (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar6;
            return;
          }
          uVar18 = 1;
LAB_0023fb60:
          pRVar11 = local_90 + 1;
          puVar17 = bits_flag + (uVar18 - 1) * lVar8;
          puVar22 = bits_start + uVar18 * lVar8;
          puVar7 = puVar22 + lVar8;
          uVar12 = *puVar22;
          lVar21 = 0;
          local_90 = pRVar11;
          do {
            lVar14 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
              }
            }
            lVar20 = lVar21;
            if (uVar12 == 0) {
              do {
                puVar22 = puVar22 + 1;
                if (puVar22 == puVar7) {
                  local_90->start_pos = 0xffff;
                  local_90->end_pos = 0xffff;
                  uVar18 = uVar18 + 1;
                  runs = pRVar11;
                  if (uVar18 != (uint)height) goto LAB_0023fb60;
                  goto LAB_0023fe8d;
                }
                lVar20 = lVar21 + 0x40;
                uVar12 = *puVar22;
                lVar14 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                  }
                }
                lVar21 = lVar20;
              } while (uVar12 == 0);
            }
            uVar12 = (~uVar12 >> ((byte)lVar14 & 0x3f)) << ((byte)lVar14 & 0x3f);
            lVar23 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
              }
            }
            lVar21 = lVar20;
            if (uVar12 == 0) {
              do {
                lVar21 = lVar21 + 0x40;
                puVar1 = puVar22 + 1;
                puVar22 = puVar22 + 1;
                uVar12 = ~*puVar1;
                lVar23 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                  }
                }
              } while (*puVar1 == 0xffffffffffffffff);
            }
            uVar13 = (ushort)(lVar14 + lVar20);
            uVar6 = (uint)(lVar14 + lVar20) & 0xffff;
            pRVar24 = runs;
            do {
              runs = pRVar24;
              uVar2 = runs->end_pos;
              pRVar24 = runs + 1;
            } while (uVar2 < uVar6);
            uVar10 = runs->start_pos;
            local_98 = (uint)(lVar23 + lVar21);
            uVar16 = local_98 & 0xffff;
            uVar5 = (unsigned_short)(lVar23 + lVar21);
            if (uVar16 < uVar10) {
              local_90->start_pos = uVar13;
              local_90->end_pos = uVar5;
              RemSP::P_[RemSP::length_] = RemSP::length_;
              uVar6 = RemSP::length_ + 1;
              local_90->label = RemSP::length_;
              RemSP::length_ = uVar6;
            }
            else {
              if (uVar10 <= uVar6) {
                uVar10 = uVar13;
              }
              if (uVar2 < uVar16) {
                local_98 = local_98 & 0xffff;
                uVar19 = is_connected(this,puVar17,(uint)uVar10,(uint)uVar2);
                if (uVar19 == 0) {
                  uVar16 = 0;
                }
                else {
                  uVar16 = RemSP::P_[runs->label];
                }
                uVar2 = pRVar24->start_pos;
                runs = pRVar24;
                while (uVar6 = uVar16, uVar2 <= local_98) {
                  if (local_98 <= runs->end_pos) {
                    uVar19 = is_connected(this,puVar17,(uint)uVar2,local_98);
                    if (((uVar19 != 0) && (uVar3 = RemSP::P_[runs->label], uVar16 != uVar3)) &&
                       (uVar6 = uVar3, uVar16 != 0)) {
                      uVar6 = RemSP::Merge(uVar16,uVar3);
                    }
                    break;
                  }
                  uVar19 = is_connected(this,puVar17,(uint)uVar2,(uint)runs->end_pos);
                  if (((uVar19 != 0) && (uVar3 = RemSP::P_[runs->label], uVar16 != uVar3)) &&
                     (uVar6 = uVar3, uVar16 != 0)) {
                    uVar6 = RemSP::Merge(uVar16,uVar3);
                  }
                  pRVar24 = runs + 1;
                  runs = runs + 1;
                  uVar16 = uVar6;
                  uVar2 = pRVar24->start_pos;
                }
                if (uVar6 == 0) {
                  RemSP::P_[RemSP::length_] = RemSP::length_;
                  uVar6 = RemSP::length_;
                  RemSP::length_ = RemSP::length_ + 1;
                }
              }
              else {
                uVar19 = is_connected(this,puVar17,(uint)uVar10,uVar16);
                if (uVar19 == 0) {
                  RemSP::P_[RemSP::length_] = RemSP::length_;
                  uVar6 = RemSP::length_;
                  RemSP::length_ = RemSP::length_ + 1;
                }
                else {
                  uVar6 = RemSP::P_[runs->label];
                }
              }
              local_90->label = uVar6;
              local_90->start_pos = uVar13;
              local_90->end_pos = uVar5;
            }
            uVar12 = ~uVar12 & -1L << ((byte)lVar23 & 0x3f);
            local_90 = local_90 + 1;
          } while( true );
        }
        sVar15 = sVar15 + 0x40;
        uVar19 = *puVar17;
        lVar21 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
          }
        }
        sVar9 = (short)lVar21;
      } while (uVar19 == 0);
    }
    uVar18 = (~uVar19 >> ((byte)sVar9 & 0x3f)) << ((byte)sVar9 & 0x3f);
    local_90->start_pos = sVar9 + sVar15;
    lVar21 = 0;
    if (uVar18 != 0) {
      for (; (uVar18 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
      }
    }
    sVar9 = (short)lVar21;
    if (uVar18 == 0) {
      do {
        sVar15 = sVar15 + 0x40;
        puVar22 = puVar17 + 1;
        puVar17 = puVar17 + 1;
        uVar18 = ~*puVar22;
        lVar21 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
          }
        }
        sVar9 = (short)lVar21;
      } while (*puVar22 == 0xffffffffffffffff);
    }
    uVar19 = (~uVar18 >> ((byte)sVar9 & 0x3f)) << ((byte)sVar9 & 0x3f);
    local_90->end_pos = sVar9 + sVar15;
    puVar4[RemSP::length_] = RemSP::length_;
    uVar6 = RemSP::length_ + 1;
    local_90->label = RemSP::length_;
    RemSP::length_ = uVar6;
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

void FindRuns(const uint64_t* bits_start, const uint64_t* bits_flag, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first merged row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::NewLabel();
        }
        out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits_f = bits_flag + data_width * (row - 1);
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;

            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this slice starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::NewLabel();
                    continue;
                };

                //Next upper run can not meet this
                unsigned short cross_st = (start_pos >= runs_up->start_pos) ? start_pos : runs_up->start_pos;
                if (end_pos <= runs_up->end_pos) {
                    if (is_connected(bits_f, cross_st, end_pos)) runs->label = LabelsSolver::GetLabel(runs_up->label);
                    else runs->label = LabelsSolver::NewLabel();
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    continue;
                }

                unsigned label;
                if (is_connected(bits_f, cross_st, runs_up->end_pos)) label = LabelsSolver::GetLabel(runs_up->label);
                else label = 0;
                runs_up++;

                //Find next upper runs meet this
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    if (end_pos <= runs_up->end_pos) {
                        if (is_connected(bits_f, runs_up->start_pos, end_pos)) {
                            unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::Merge(label, label_other) : label_other;
                            }
                        }
                        break;
                    }
                    else {
                        if (is_connected(bits_f, runs_up->start_pos, runs_up->end_pos)) {
                            unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::Merge(label, label_other) : label_other;
                            }
                        }
                    }
                }

                if (label) runs->label = label;
                else runs->label = LabelsSolver::NewLabel();
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
            }
        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::Flatten();
    }